

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void s_split(string *s,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *tokens,char delim)

{
  size_t sVar1;
  size_t pos;
  anon_class_40_2_b75c6d7b string_find_first_not;
  anon_class_40_2_b75c6d7b aStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(tokens);
  std::__cxx11::string::string((string *)&aStack_78,(string *)s);
  pos = 0;
  aStack_78.delim = delim;
  while( true ) {
    sVar1 = s_split::anon_class_40_2_b75c6d7b::operator()(&aStack_78,pos);
    pos = std::__cxx11::string::find((char)s,(ulong)(uint)(int)delim);
    if (sVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tokens,&local_50
              );
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&aStack_78);
  return;
}

Assistant:

void s_split(const string &s, vector<string> &tokens, char delim = ' ')
{
    tokens.clear();
    auto string_find_first_not = [s, delim](size_t pos = 0) -> size_t {
        for (size_t i = pos; i < s.size(); i++) {
            if (s[i] != delim)
                return i;
        }
        return string::npos;
    };
    size_t lastPos = string_find_first_not(0);
    size_t pos = s.find(delim, lastPos);
    while (lastPos != string::npos) {
        tokens.emplace_back(s.substr(lastPos, pos - lastPos));
        lastPos = string_find_first_not(pos);
        pos = s.find(delim, lastPos);
    }
}